

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::list<trompeloeil::condition_base<int_&(int_&)>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::condition_base<int_&(int_&)>,_trompeloeil::delete_disposer> *this)

{
  ~list(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }